

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsonmodelserialiser.cpp
# Opt level: O3

bool __thiscall JsonModelSerialiser::loadModel(JsonModelSerialiser *this,QByteArray *source)

{
  undefined1 uVar1;
  QString loadString;
  QTextStream reader;
  QArrayData *local_38 [3];
  QTextStream local_20 [16];
  
  QTextStream::QTextStream(local_20,source,0x11);
  QTextStream::readAll();
  uVar1 = (**(code **)(*(long *)&(this->super_AbstractStringSerialiser).
                                 super_AbstractModelSerialiser + 200))(this,local_38);
  if (local_38[0] != (QArrayData *)0x0) {
    LOCK();
    (local_38[0]->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_38[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_38[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_38[0],2,8);
    }
  }
  QTextStream::~QTextStream(local_20);
  return (bool)uVar1;
}

Assistant:

bool JsonModelSerialiser::loadModel(const QByteArray &source)
{
    QTextStream reader(source, QIODevice::ReadOnly | QIODevice::Text);
#if (QT_VERSION < QT_VERSION_CHECK(6, 0, 0))
    reader.setCodec(textCodec());
#endif
    QString loadString = reader.readAll();
    return loadModel(&loadString);
}